

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

void __thiscall Assimp::FIUUIDValueImpl::~FIUUIDValueImpl(FIUUIDValueImpl *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  (this->super_FIUUIDValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__008e6618;
  pcVar1 = (this->strValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->strValue).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FIUUIDValue).super_FIByteValue.super_FIValue._vptr_FIValue =
       (_func_int **)&PTR___cxa_pure_virtual_008e6078;
  puVar2 = (this->super_FIUUIDValue).super_FIByteValue.value.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

inline FIUUIDValueImpl(std::vector<uint8_t> &&value_): strValueValid(false) { value = std::move(value_); }